

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref.h
# Opt level: O2

bool __thiscall
embree::SceneLoadingTutorialApplication::scene_empty_post_parse
          (SceneLoadingTutorialApplication *this)

{
  GroupNode *pGVar1;
  
  pGVar1 = (this->scene).ptr;
  if (((pGVar1->children).
       super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       (pGVar1->children).
       super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start) &&
     ((this->sceneFilename).super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->sceneFilename).super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>.
      _M_impl.super__Vector_impl_data._M_start)) {
    return (this->futures).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish ==
           (this->futures).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  }
  return false;
}

Assistant:

__forceinline const Type* operator ->() const { return  ptr; }